

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  cf_hash_drbg_sha256 *ctx;
  uint32_t uVar1;
  int __fd;
  ssize_t sVar2;
  int *piVar3;
  size_t __nbytes;
  undefined1 *__buf;
  long *in_FS_OFFSET;
  uint8_t entropy [256];
  undefined1 local_138 [128];
  undefined1 local_b8 [136];
  
  ctx = (cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74);
  uVar1 = cf_hash_drbg_sha256_needs_reseed(ctx);
  if (uVar1 != 0) {
    __fd = open("/dev/urandom",0x80000);
    if ((__fd == -1) && (__fd = open("/dev/random",0x80000), __fd == -1)) {
LAB_0012431f:
      ptls_minicrypto_random_bytes_cold_2();
      return;
    }
    __nbytes = 0x100;
    __buf = local_138;
    do {
      while (sVar2 = read(__fd,__buf,__nbytes), sVar2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
LAB_0012431a:
          ptls_minicrypto_random_bytes_cold_1();
          goto LAB_0012431f;
        }
      }
      if (sVar2 < 0) goto LAB_0012431a;
      __buf = __buf + sVar2;
      __nbytes = __nbytes - sVar2;
    } while (__nbytes != 0);
    close(__fd);
    cf_hash_drbg_sha256_init(ctx,local_138,0x80,local_b8,0x80,"ptls",4);
  }
  cf_hash_drbg_sha256_gen(ctx,buf,len);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
    static PTLS_THREADLOCAL cf_hash_drbg_sha256 ctx;

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}